

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void stream_buffer_decrement(cubeb_stream_conflict1 *stm,long count)

{
  long lVar1;
  void *__dest;
  ssize_t sVar2;
  size_t __n;
  long in_RSI;
  long in_RDI;
  char *bufremains;
  
  lVar1 = *(long *)(in_RDI + 0xf8);
  sVar2 = (*cubeb_snd_pcm_frames_to_bytes)(*(snd_pcm_t **)(in_RDI + 0x38),in_RSI);
  __dest = *(void **)(in_RDI + 0xf8);
  __n = (*cubeb_snd_pcm_frames_to_bytes)
                  (*(snd_pcm_t **)(in_RDI + 0x38),*(long *)(in_RDI + 0x100) - in_RSI);
  memmove(__dest,(void *)(lVar1 + sVar2),__n);
  *(long *)(in_RDI + 0x100) = *(long *)(in_RDI + 0x100) - in_RSI;
  return;
}

Assistant:

static void
stream_buffer_decrement(cubeb_stream * stm, long count)
{
  char * bufremains =
      stm->buffer + WRAP(snd_pcm_frames_to_bytes)(stm->pcm, count);
  memmove(stm->buffer, bufremains,
          WRAP(snd_pcm_frames_to_bytes)(stm->pcm, stm->bufframes - count));
  stm->bufframes -= count;
}